

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printNum(JSPrinter *this,Ref node)

{
  double *pdVar1;
  char *s;
  
  pdVar1 = cashew::Value::getNumber(node.inst);
  if ((*pdVar1 <= 0.0 && *pdVar1 != 0.0) && (this->buffer[this->used - 1] == '-')) {
    emit(this,' ');
  }
  pdVar1 = cashew::Value::getNumber(node.inst);
  s = numToString(*pdVar1,this->finalize);
  emit(this,s);
  return;
}

Assistant:

void printNum(Ref node) {
    if (node->getNumber() < 0 && buffer[used - 1] == '-') {
      emit(' '); // cannot join - and - to --, looks like the -- operator
    }
    emit(numToString(node->getNumber(), finalize));
  }